

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O3

void __thiscall sentencepiece::SelfTestData_Sample::~SelfTestData_Sample(SelfTestData_Sample *this)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)(this->input_).tagged_ptr_.ptr_;
  if (puVar1 != &google::protobuf::internal::fixed_address_empty_string) {
    if ((long *)*puVar1 != puVar1 + 2) {
      operator_delete((long *)*puVar1,puVar1[2] + 1);
    }
    operator_delete(puVar1,0x20);
  }
  puVar1 = (undefined8 *)(this->expected_).tagged_ptr_.ptr_;
  if (puVar1 != &google::protobuf::internal::fixed_address_empty_string) {
    if ((long *)*puVar1 != puVar1 + 2) {
      operator_delete((long *)*puVar1,puVar1[2] + 1);
    }
    operator_delete(puVar1,0x20);
  }
  google::protobuf::internal::InternalMetadata::Delete<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

SelfTestData_Sample::~SelfTestData_Sample() {
  // @@protoc_insertion_point(destructor:sentencepiece.SelfTestData.Sample)
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}